

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_extract.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ListExtractBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 auVar2 [8];
  element_type *peVar3;
  _Alloc_hider _Var4;
  reference pvVar5;
  pointer pEVar6;
  LogicalType *pLVar7;
  reference pvVar8;
  undefined8 *puVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  LogicalType child_type;
  undefined1 local_70 [8];
  element_type *local_68;
  _Alloc_hider _Stack_60;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_58;
  undefined1 local_50 [24];
  LogicalType local_38;
  
  pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  local_58._M_head_impl =
       (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  BoundCastExpression::AddArrayCastToList
            ((BoundCastExpression *)local_70,context,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_58);
  pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  auVar2 = local_70;
  local_70 = (undefined1  [8])0x0;
  _Var1._M_head_impl =
       (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)auVar2;
  if (_Var1._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
  }
  if (local_70 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_70 + 8))();
  }
  local_70 = (undefined1  [8])0x0;
  if (local_58._M_head_impl != (Expression *)0x0) {
    (*((local_58._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_58._M_head_impl = (Expression *)0x0;
  pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar5);
  pLVar7 = ListType::GetChildType(&pEVar6->return_type);
  LogicalType::LogicalType((LogicalType *)local_50,pLVar7);
  pLVar7 = &(bound_function->super_BaseScalarFunction).return_type;
  if (pLVar7 != (LogicalType *)local_50) {
    (bound_function->super_BaseScalarFunction).return_type.id_ = local_50[0];
    (bound_function->super_BaseScalarFunction).return_type.physical_type_ = local_50[1];
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&(bound_function->super_BaseScalarFunction).return_type.type_info_,
               (shared_ptr<duckdb::ExtraTypeInfo,_true> *)(local_50 + 8));
  }
  LogicalType::LIST((LogicalType *)local_70,(LogicalType *)local_50);
  pvVar8 = vector<duckdb::LogicalType,_true>::operator[]
                     (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments,0);
  _Var4._M_p = _Stack_60._M_p;
  peVar3 = local_68;
  pvVar8->id_ = local_70[0];
  pvVar8->physical_type_ = local_70[1];
  uVar10 = *(undefined4 *)
            &(pvVar8->type_info_).internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar11 = *(undefined4 *)
            ((long)&(pvVar8->type_info_).internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4
            );
  uVar12 = *(undefined4 *)
            &(pvVar8->type_info_).internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  uVar13 = *(undefined4 *)
            ((long)&(pvVar8->type_info_).internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 4);
  (pvVar8->type_info_).internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (pvVar8->type_info_).internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68 = (element_type *)0x0;
  _Stack_60._M_p = (pointer)0x0;
  this_00 = (pvVar8->type_info_).internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pvVar8->type_info_).internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  (pvVar8->type_info_).internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var4._M_p;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_38._0_4_ = uVar10;
    local_38._4_4_ = uVar11;
    local_38.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = uVar12;
    local_38.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ = uVar13;
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    uVar10 = local_38._0_4_;
    uVar11 = local_38._4_4_;
    uVar12 = local_38.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_;
    uVar13 = local_38.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_;
  }
  _Var4._M_p = _Stack_60._M_p;
  local_68 = (element_type *)CONCAT44(uVar11,uVar10);
  _Stack_60._M_p._4_4_ = uVar13;
  _Stack_60._M_p._0_4_ = uVar12;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var4._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var4._M_p);
  }
  LogicalType::~LogicalType((LogicalType *)local_70);
  puVar9 = (undefined8 *)operator_new(0x20);
  LogicalType::LogicalType((LogicalType *)local_70,pLVar7);
  *puVar9 = &PTR__VariableReturnBindData_0243ce10;
  LogicalType::LogicalType((LogicalType *)(puVar9 + 1),(LogicalType *)local_70);
  LogicalType::~LogicalType((LogicalType *)local_70);
  *(undefined8 **)this = puVar9;
  LogicalType::~LogicalType((LogicalType *)local_50);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> ListExtractBind(ClientContext &context, ScalarFunction &bound_function,
                                                vector<unique_ptr<Expression>> &arguments) {
	D_ASSERT(bound_function.arguments.size() == 2);
	arguments[0] = BoundCastExpression::AddArrayCastToList(context, std::move(arguments[0]));

	D_ASSERT(LogicalTypeId::LIST == arguments[0]->return_type.id());
	// list extract returns the child type of the list as return type
	auto child_type = ListType::GetChildType(arguments[0]->return_type);

	bound_function.return_type = child_type;
	bound_function.arguments[0] = LogicalType::LIST(child_type);
	return make_uniq<VariableReturnBindData>(bound_function.return_type);
}